

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O2

bool __thiscall PhyloTree::equals(PhyloTree *this,PhyloTree *t)

{
  bool bVar1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_70;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_58;
  _Vector_base<double,_std::allocator<double>_> local_40;
  _Vector_base<double,_std::allocator<double>_> local_28;
  
  bVar1 = std::operator==(&this->leaf2NumMap,&t->leaf2NumMap);
  if (bVar1) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_28,&this->leafEdgeLengths);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_40,&t->leafEdgeLengths);
    bVar1 = Tools::vector_equal<double>
                      ((vector<double,_std::allocator<double>_> *)&local_28,
                       (vector<double,_std::allocator<double>_> *)&local_40);
    if (bVar1) {
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector(&local_58,&this->edges);
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector(&local_70,&t->edges);
      bVar1 = Tools::vector_equal<PhyloTreeEdge>(&local_58,&local_70);
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_70);
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_58);
    }
    else {
      bVar1 = false;
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_40);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_28);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool PhyloTree::equals(const PhyloTree& t) {
    return (leaf2NumMap == t.leaf2NumMap) && Tools::vector_equal(leafEdgeLengths, t.leafEdgeLengths) && Tools::vector_equal(edges, t.edges);
}